

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::ShutdownedWrite::tryRead
          (ShutdownedWrite *this,void *readBufferPtr,size_t minBytes,size_t maxBytes)

{
  size_t maxBytes_local;
  size_t minBytes_local;
  void *readBufferPtr_local;
  ShutdownedWrite *this_local;
  
  constPromise<unsigned_long,_0UL>();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* readBufferPtr, size_t minBytes, size_t maxBytes) override {
      return constPromise<size_t, 0>();
    }